

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O3

pair<unsigned_int,_unsigned_int> __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
::initial_bucketing(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
                    *this,uint k)

{
  pointer puVar1;
  byte *pbVar2;
  ulong uVar3;
  byte bVar4;
  void *__s;
  ostream *poVar5;
  ulong *puVar6;
  short sVar7;
  uint uVar8;
  comm *pcVar9;
  ulong uVar10;
  byte *pbVar11;
  uint uVar12;
  size_t c;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> alphabet_hist;
  unsigned_long local_88;
  suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long,_false>
  *local_80;
  ulong local_78;
  ulong local_70;
  comm *local_68;
  uint local_5c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  ulong local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar14 = (this->part).div + (ulong)((long)this->p - 1U < (this->part).mod);
  pcVar9 = &this->comm;
  alphabet_histogram<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
            (&local_48,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->input_begin)._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(this->input_end)._M_current,pcVar9);
  __s = operator_new(0x200);
  lVar13 = 0;
  memset(__s,0,0x200);
  sVar7 = 1;
  do {
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar13] != 0) {
      *(short *)((long)__s + lVar13 * 2) = sVar7;
      sVar7 = sVar7 + 1;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x100);
  lVar13 = 0;
  iVar16 = 0;
  iVar17 = 0;
  do {
    puVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + lVar13;
    iVar16 = (iVar16 - (uint)((int)*puVar1 == 0 && *(int *)((long)puVar1 + 4) == 0)) + 1;
    iVar17 = (iVar17 - (uint)((int)puVar1[1] == 0 && *(int *)((long)puVar1 + 0xc) == 0)) + 1;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0x100);
  uVar15 = iVar17 + iVar16;
  uVar12 = 0x20;
  if (uVar15 != 0) {
    uVar12 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar12 = uVar12 ^ 0x1f;
  }
  local_70 = CONCAT44(local_70._4_4_,uVar15);
  local_78 = (ulong)(0x20 - uVar12);
  bVar4 = 0x40 / (byte)(0x20 - uVar12);
  uVar10 = (ulong)(uint)bVar4;
  if (k - 1 < (uint)bVar4) {
    uVar10 = (ulong)k;
  }
  local_80 = this;
  local_68 = pcVar9;
  if (bVar4 < k) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[WARNING] given `k` value of ",0x1d);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," is too large, setting k=",0x19);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," instead.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar10 = (ulong)(uint)bVar4;
  }
  uVar3 = local_78;
  uVar15 = (uint)uVar10;
  if (uVar14 <= uVar10) {
    uVar15 = (int)uVar14 - (uint)(1 < uVar14 && (local_80->comm).m_size == 1);
  }
  if ((local_80->comm).m_rank == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Detecting sigma=",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," => l=",6);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", k=",4);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar16 = uVar15 * (int)local_78;
  local_50 = -1L << ((byte)iVar16 & 0x3f);
  pbVar11 = (byte *)(local_80->input_begin)._M_current;
  local_88 = 0;
  local_5c = uVar15 - 1;
  bVar4 = (byte)uVar3;
  if (local_5c != 0) {
    local_88 = 0;
    uVar8 = local_5c;
    do {
      local_88 = local_88 << (bVar4 & 0x3f) | (ulong)*(ushort *)((long)__s + (ulong)*pbVar11 * 2);
      pbVar11 = pbVar11 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  local_70 = (ulong)uVar15;
  local_68 = (comm *)mxx::left_shift<unsigned_long>(&local_88,local_68);
  puVar6 = (local_80->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(local_80->local_B).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3 != local_80->local_size) {
    local_58 = &local_80->local_B;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (local_58,local_80->local_size);
    puVar6 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  uVar14 = -(ulong)(iVar16 == 0) | ~local_50;
  pbVar2 = (byte *)(local_80->input_end)._M_current;
  for (; pbVar11 != pbVar2; pbVar11 = pbVar11 + 1) {
    local_88 = ((ulong)*(ushort *)((long)__s + (ulong)*pbVar11 * 2) | local_88 << (bVar4 & 0x3f)) &
               uVar14;
    *puVar6 = local_88;
    puVar6 = puVar6 + 1;
  }
  pcVar9 = (comm *)0;
  if ((local_80->comm).m_rank < (local_80->comm).m_size + -1) {
    pcVar9 = local_68;
  }
  if (local_5c != 0) {
    iVar16 = (uVar15 - 2) * (int)local_78;
    uVar10 = 0;
    do {
      local_88 = ((ulong)pcVar9 >> ((byte)iVar16 & 0x3f) | local_88 << (bVar4 & 0x3f)) & uVar14;
      puVar6[uVar10] = local_88;
      uVar10 = uVar10 + 1;
      iVar16 = iVar16 + (uVar12 - 0x20);
    } while (local_5c != uVar10);
  }
  operator_delete(__s);
  uVar14 = local_70;
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (pair<unsigned_int,_unsigned_int>)(uVar14 | local_78 << 0x20);
}

Assistant:

std::pair<unsigned int, unsigned int> initial_bucketing(unsigned int k = 0)
{
    std::size_t min_local_size = part.local_size(p-1);

    // get global alphabet histogram
    std::vector<index_t> alphabet_hist = alphabet_histogram<InputIterator, index_t>(input_begin, input_end, comm);
    // get mapping table and alphabet sizes
    std::vector<uint16_t> alphabet_mapping = alphabet_mapping_tbl(alphabet_hist);
    unsigned int sigma = alphabet_unique_chars(alphabet_hist);
    // bits per character: set l=ceil(log(sigma))
    unsigned int l = alphabet_bits_per_char(sigma);
    // number of characters per word => the `k` in `k-mer`
    unsigned int opt_k = alphabet_chars_per_word<index_t>(l);
    if (k == 0 || k > opt_k) {
        if (k > opt_k)
            std::cerr << "[WARNING] given `k` value of " << k << " is too large, setting k=" << opt_k << " instead." << std::endl;
        k = opt_k;
    }
    // if the input is too small for `k`, choose a smaller `k`
    if (k >= min_local_size) {
        k = min_local_size;
        if (comm.size() == 1 && k > 1)
            k--;
    }

    if (comm.rank() == 0)
        INFO("Detecting sigma=" << sigma << " => l=" << l << ", k=" << k);

    // get k-mer mask
    index_t kmer_mask = ((static_cast<index_t>(1) << (l*k)) - static_cast<index_t>(1));
    if (kmer_mask == 0)
        kmer_mask = ~static_cast<index_t>(0);

    // sliding window k-mer (for prototype only using ASCII alphabet)

    // fill first k-mer (until k-1 positions) and send to left processor
    // filling k-mer with first character = MSBs for lexicographical ordering
    InputIterator str_it = input_begin;
    index_t kmer = 0;
    for (unsigned int i = 0; i < k-1; ++i) {
        kmer <<= l;
        index_t s = (unsigned char)(*str_it);
        kmer |= alphabet_mapping[s];
        ++str_it;
    }

    // send first kmer to left processor
    // TODO: use async left shift!
    index_t last_kmer = mxx::left_shift(kmer, comm);

    // init output
    if (local_B.size() != local_size)
        local_B.resize(local_size);
    auto buk_it = local_B.begin();
    // continue to create all k-mers and add into histogram count
    while (str_it != input_end) {
        // get next kmer
        kmer <<= l;
        index_t s = (unsigned char)(*str_it);
        kmer |= alphabet_mapping[s];
        kmer &= kmer_mask;
        // add to bucket number array
        *buk_it = kmer;
        // increase iterators
        ++str_it;
        ++buk_it;
    }

    // finish the receive to get the last k-1 k-kmers with string data from the
    // processor to the right
    // if not last processor
    if (comm.rank() < comm.size()-1) {
        // TODO: use mxx::future to handle this async left shift
        // wait for the async receive to finish
        //MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
        //req.wait();
    } else {
        // in this case the last k-mers contains shifting `$` signs
        // we assume this to be the `\0` value
        last_kmer = 0;
    }


    // construct last (k-1) k-mers
    for (unsigned int i = 0; i < k-1; ++i) {
        kmer <<= l;
        kmer |= (last_kmer >> (l*(k-i-2)));
        kmer &= kmer_mask;

        // add to bucket number array
        *buk_it = kmer;
        ++buk_it;
    }

    // return the number of characters which are part of each bucket number
    // (i.e., k-mer)
    return std::make_pair(k, l);
}